

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O3

string * __thiscall
Sock::RecvUntilTerminator_abi_cxx11_
          (string *__return_storage_ptr__,Sock *this,uint8_t terminator,milliseconds timeout,
          CThreadInterrupt *interrupt,size_t max_data)

{
  bool bVar1;
  int iVar2;
  time_point tVar3;
  undefined4 extraout_var;
  char *pcVar5;
  int extraout_var_00;
  int *piVar6;
  runtime_error *prVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar8;
  long lVar9;
  long *args_2;
  long lVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  ssize_t read_ret;
  ssize_t peek_ret;
  size_t try_len;
  char buf [512];
  char *local_290;
  char *local_288;
  uint8_t local_279;
  char *local_278 [4];
  string local_258;
  string local_238 [16];
  long local_38;
  char *pcVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = (long *)max_data;
  local_279 = terminator;
  tVar3 = NodeClock::now();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (max_data != 0) {
    lVar10 = (long)tVar3.__d.__r / 1000000 + timeout.__r;
    uVar8 = 0;
    do {
      uVar8 = max_data - uVar8;
      if (0x1ff < uVar8) {
        uVar8 = 0x200;
      }
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      iVar2 = (*this->_vptr_Sock[4])(this,local_238,uVar8);
      pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
      local_288 = pcVar4;
      if (pcVar4 == (char *)0xffffffffffffffff) {
        piVar6 = __errno_location();
        iVar2 = *piVar6;
        if (((iVar2 != 4) && (iVar2 != 0xb)) && (iVar2 != 0x73)) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          SysErrorString_abi_cxx11_((int)((ulong)&__return_storage_ptr__->field_2 >> 0x20));
          tinyformat::format<std::__cxx11::string>
                    (&local_258,(tinyformat *)"recv(): %s",(char *)local_278,args);
          std::runtime_error::runtime_error(prVar7,(string *)&local_258);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00dd1748;
        }
      }
      else {
        if (pcVar4 == (char *)0x0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Connection unexpectedly closed by peer");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00dd1748;
        }
        pcVar11 = pcVar4 + (long)&local_238[0]._M_dataplus;
        pcVar5 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                           (local_238,pcVar11,&local_279);
        if (pcVar5 != pcVar11) {
          pcVar4 = pcVar5 + (1 - (long)local_238);
        }
        local_278[0] = pcVar4;
        iVar2 = (*this->_vptr_Sock[4])(this,local_238,pcVar4,0);
        local_290 = (char *)CONCAT44(extraout_var_00,iVar2);
        if ((extraout_var_00 < 0) || (local_290 != pcVar4)) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<long,unsigned_long,long>
                    (&local_258,
                     (tinyformat *)
                     "recv() returned %u bytes on attempt to read %u bytes but previous peek claimed %u bytes are available"
                     ,(char *)&local_290,(long *)local_278,(unsigned_long *)&local_288,args_2);
          std::runtime_error::runtime_error(prVar7,(string *)&local_258);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00dd1748;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                   (char *)local_238,(long)pcVar4 - (ulong)(pcVar5 != pcVar11));
        if (pcVar5 != pcVar11) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            return __return_storage_ptr__;
          }
          goto LAB_00dd1748;
        }
      }
      tVar3 = NodeClock::now();
      lVar9 = lVar10 - (long)tVar3.__d.__r / 1000000;
      if (lVar9 == 0 || lVar10 < (long)tVar3.__d.__r / 1000000) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_278[0] = (char *)__return_storage_ptr__->_M_string_length;
        tinyformat::format<unsigned_long>
                  (&local_258,"Receive timeout (received %u bytes without terminator before that)",
                   (unsigned_long *)local_278);
        std::runtime_error::runtime_error(prVar7,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00dd1748;
      }
      bVar1 = CThreadInterrupt::operator_cast_to_bool(interrupt);
      if (bVar1) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_278[0] = (char *)__return_storage_ptr__->_M_string_length;
        tinyformat::format<unsigned_long>
                  (&local_258,
                   "Receive interrupted (received %u bytes without terminator before that)",
                   (unsigned_long *)local_278);
        std::runtime_error::runtime_error(prVar7,(string *)&local_258);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00dd1748;
      }
      if (999 < lVar9) {
        lVar9 = 1000;
      }
      (*this->_vptr_Sock[0xe])(this,lVar9,1,0);
      uVar8 = __return_storage_ptr__->_M_string_length;
    } while (uVar8 < max_data);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_258._M_dataplus._M_p = (pointer)__return_storage_ptr__->_M_string_length;
  tinyformat::format<unsigned_long>
            (local_238,"Received too many bytes without a terminator (%u)",
             (unsigned_long *)&local_258);
  std::runtime_error::runtime_error(prVar7,(string *)local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00dd1748:
  __stack_chk_fail();
}

Assistant:

std::string Sock::RecvUntilTerminator(uint8_t terminator,
                                      std::chrono::milliseconds timeout,
                                      CThreadInterrupt& interrupt,
                                      size_t max_data) const
{
    const auto deadline = GetTime<std::chrono::milliseconds>() + timeout;
    std::string data;
    bool terminator_found{false};

    // We must not consume any bytes past the terminator from the socket.
    // One option is to read one byte at a time and check if we have read a terminator.
    // However that is very slow. Instead, we peek at what is in the socket and only read
    // as many bytes as possible without crossing the terminator.
    // Reading 64 MiB of random data with 262526 terminator chars takes 37 seconds to read
    // one byte at a time VS 0.71 seconds with the "peek" solution below. Reading one byte
    // at a time is about 50 times slower.

    for (;;) {
        if (data.size() >= max_data) {
            throw std::runtime_error(
                strprintf("Received too many bytes without a terminator (%u)", data.size()));
        }

        char buf[512];

        const ssize_t peek_ret{Recv(buf, std::min(sizeof(buf), max_data - data.size()), MSG_PEEK)};

        switch (peek_ret) {
        case -1: {
            const int err{WSAGetLastError()};
            if (IOErrorIsPermanent(err)) {
                throw std::runtime_error(strprintf("recv(): %s", NetworkErrorString(err)));
            }
            break;
        }
        case 0:
            throw std::runtime_error("Connection unexpectedly closed by peer");
        default:
            auto end = buf + peek_ret;
            auto terminator_pos = std::find(buf, end, terminator);
            terminator_found = terminator_pos != end;

            const size_t try_len{terminator_found ? terminator_pos - buf + 1 :
                                                    static_cast<size_t>(peek_ret)};

            const ssize_t read_ret{Recv(buf, try_len, 0)};

            if (read_ret < 0 || static_cast<size_t>(read_ret) != try_len) {
                throw std::runtime_error(
                    strprintf("recv() returned %u bytes on attempt to read %u bytes but previous "
                              "peek claimed %u bytes are available",
                              read_ret, try_len, peek_ret));
            }

            // Don't include the terminator in the output.
            const size_t append_len{terminator_found ? try_len - 1 : try_len};

            data.append(buf, buf + append_len);

            if (terminator_found) {
                return data;
            }
        }

        const auto now = GetTime<std::chrono::milliseconds>();

        if (now >= deadline) {
            throw std::runtime_error(strprintf(
                "Receive timeout (received %u bytes without terminator before that)", data.size()));
        }

        if (interrupt) {
            throw std::runtime_error(strprintf(
                "Receive interrupted (received %u bytes without terminator before that)",
                data.size()));
        }

        // Wait for a short while (or the socket to become ready for reading) before retrying.
        const auto wait_time = std::min(deadline - now, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
        (void)Wait(wait_time, RECV);
    }
}